

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O1

void __thiscall ast::Dir_space::Dir_space(Dir_space *this,Expression *s,Expression *i,Location left)

{
  Expression *pEVar1;
  long lVar2;
  int iVar3;
  string local_48;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013bf38;
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  *(undefined4 *)&(this->super_Directive).super_Statement.location.unit = left.unit._0_4_;
  *(undefined4 *)((long)&(this->super_Directive).super_Statement.location.unit + 4) =
       left.unit._4_4_;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement.section_index = 0;
  (this->super_Directive).super_Statement.section_offset = 0;
  (this->super_Directive).super_Statement.size_in_memory = 0;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_space_0013c8b0;
  this->size = s;
  this->initial = i;
  lVar2 = Sections::current_section;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar2 + 0x30);
  iVar3 = (*s->_vptr_Expression[3])(s);
  pEVar1 = this->size;
  if ((char)iVar3 == '\0') {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Size parameter for .space directive must be defined before","");
    error_report(&pEVar1->location,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    (this->super_Directive).super_Statement.size_in_memory = (uint)(ushort)pEVar1->value;
  }
  Sections::increase((this->super_Directive).super_Statement.section_index,
                     (uint)(ushort)(this->super_Directive).super_Statement.size_in_memory);
  return;
}

Assistant:

Dir_space::Dir_space (Expression *s, Expression *i, Location left) :
	Directive {left}, size {s}, initial {i}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	if (size->evaluate())
		size_in_memory = size->get_value();
	else
		error_report(&size->location, "Size parameter for .space directive must be defined before");
	Sections::increase(section_index, size_in_memory & 0xffff);
}